

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndObject(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            *this,Context *context,SizeType memberCount)

{
  ISchemaValidator *pIVar1;
  uint uVar2;
  int iVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Property *pPVar8;
  
  if (this->hasRequired_ == true) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x14])();
    uVar2 = this->propertyCount_;
    if (uVar2 != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        pPVar8 = this->properties_;
        if ((((&pPVar8->required)[lVar7] == true) && (context->propertyExist[uVar6] == false)) &&
           (*(int *)(*(long *)((long)&pPVar8->schema + lVar7) + 0x19c) == 0)) {
          (*context->error_handler->_vptr_IValidationErrorHandler[0x15])
                    (context->error_handler,(long)&(pPVar8->name).data_ + lVar7);
          uVar2 = this->propertyCount_;
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x38;
      } while (uVar6 < uVar2);
    }
    iVar3 = (*context->error_handler->_vptr_IValidationErrorHandler[0x16])();
    if ((char)iVar3 != '\0') {
      context->invalidCode = kValidateErrorRequired;
      this_00 = GetRequiredString();
      goto LAB_0014941f;
    }
  }
  if (memberCount < this->minProperties_) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x13])
              (context->error_handler,(ulong)memberCount);
    context->invalidCode = kValidateErrorMinProperties;
    this_00 = GetMinPropertiesString();
  }
  else if (this->maxProperties_ < memberCount) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x12])
              (context->error_handler,(ulong)memberCount);
    context->invalidCode = kValidateErrorMaxProperties;
    this_00 = GetMaxPropertiesString();
  }
  else {
    if (this->hasDependencies_ != true) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x19])();
    if (this->propertyCount_ != 0) {
      uVar6 = 0;
      do {
        if (context->propertyExist[uVar6] == true) {
          pPVar8 = this->properties_ + uVar6;
          if (pPVar8->dependencies == (bool *)0x0) {
            if (pPVar8->dependenciesSchema != (SchemaType *)0x0) {
              pIVar1 = context->validators[pPVar8->dependenciesValidatorIndex];
              iVar3 = (*pIVar1->_vptr_ISchemaValidator[2])(pIVar1);
              if ((char)iVar3 == '\0') {
                (*context->error_handler->_vptr_IValidationErrorHandler[0x1d])
                          (context->error_handler,pPVar8,pIVar1);
              }
            }
          }
          else {
            (*context->error_handler->_vptr_IValidationErrorHandler[0x1a])();
            uVar2 = this->propertyCount_;
            if (uVar2 != 0) {
              lVar7 = 0;
              uVar5 = 0;
              do {
                if ((pPVar8->dependencies[uVar5] == true) &&
                   (context->propertyExist[uVar5] == false)) {
                  (*context->error_handler->_vptr_IValidationErrorHandler[0x1b])
                            (context->error_handler,(long)&(this->properties_->name).data_ + lVar7);
                  uVar2 = this->propertyCount_;
                }
                uVar5 = uVar5 + 1;
                lVar7 = lVar7 + 0x38;
              } while (uVar5 < uVar2);
            }
            (*context->error_handler->_vptr_IValidationErrorHandler[0x1c])
                      (context->error_handler,pPVar8);
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->propertyCount_);
    }
    iVar3 = (*context->error_handler->_vptr_IValidationErrorHandler[0x1e])();
    if ((char)iVar3 == '\0') {
      return true;
    }
    context->invalidCode = kValidateErrorDependencies;
    this_00 = GetDependenciesString();
  }
LAB_0014941f:
  pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar4;
  return false;
}

Assistant:

bool EndObject(Context& context, SizeType memberCount) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndObject");
        if (hasRequired_) {
            context.error_handler.StartMissingProperties();
            for (SizeType index = 0; index < propertyCount_; index++)
                if (properties_[index].required && !context.propertyExist[index])
                    if (properties_[index].schema->defaultValueLength_ == 0 )
                        context.error_handler.AddMissingProperty(properties_[index].name);
            if (context.error_handler.EndMissingProperties())
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorRequired);
        }

        if (memberCount < minProperties_) {
            context.error_handler.TooFewProperties(memberCount, minProperties_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMinProperties);
        }

        if (memberCount > maxProperties_) {
            context.error_handler.TooManyProperties(memberCount, maxProperties_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMaxProperties);
        }

        if (hasDependencies_) {
            context.error_handler.StartDependencyErrors();
            for (SizeType sourceIndex = 0; sourceIndex < propertyCount_; sourceIndex++) {
                const Property& source = properties_[sourceIndex];
                if (context.propertyExist[sourceIndex]) {
                    if (source.dependencies) {
                        context.error_handler.StartMissingDependentProperties();
                        for (SizeType targetIndex = 0; targetIndex < propertyCount_; targetIndex++)
                            if (source.dependencies[targetIndex] && !context.propertyExist[targetIndex])
                                context.error_handler.AddMissingDependentProperty(properties_[targetIndex].name);
                        context.error_handler.EndMissingDependentProperties(source.name);
                    }
                    else if (source.dependenciesSchema) {
                        ISchemaValidator* dependenciesValidator = context.validators[source.dependenciesValidatorIndex];
                        if (!dependenciesValidator->IsValid())
                            context.error_handler.AddDependencySchemaError(source.name, dependenciesValidator);
                    }
                }
            }
            if (context.error_handler.EndDependencyErrors())
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorDependencies);
        }

        return true;
    }